

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

QCborValueConstRef __thiscall
QCborContainerPrivate::findCborMapKey<long_long>(QCborContainerPrivate *this,longlong key)

{
  Type *pTVar1;
  long lVar2;
  QCborValueConstRef QVar3;
  
  lVar2 = 1;
  for (pTVar1 = &((this->elements).d.ptr)->type;
      (lVar2 - 1U < (ulong)(this->elements).d.size &&
      ((*pTVar1 != Integer || ((((Element *)(pTVar1 + -2))->field_0).value != key))));
      pTVar1 = pTVar1 + 8) {
    lVar2 = lVar2 + 2;
  }
  QVar3.i = lVar2;
  QVar3.d = this;
  return QVar3;
}

Assistant:

QCborValueConstRef findCborMapKey(KeyType key)
    {
        qsizetype i = 0;
        for ( ; i < elements.size(); i += 2) {
            const auto &e = elements.at(i);
            bool equals;
            if constexpr (std::is_same_v<std::decay_t<KeyType>, QCborValue>) {
                equals = (compareElement(i, key, QtCbor::Comparison::ForEquality) == 0);
            } else if constexpr (std::is_integral_v<KeyType>) {
                equals = (e.type == QCborValue::Integer && e.value == key);
            } else {
                // assume it's a string
                equals = stringEqualsElement(i, key);
            }
            if (equals)
                break;
        }
        return { this, i + 1 };
    }